

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitFactoredDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitFactoredDecPOMDPDiscrete::ComputeFSAOHDist
          (PlanningUnitFactoredDecPOMDPDiscrete *this,FactoredStateAOHDistribution *fsaoh,
          PartialJointPolicyDiscretePure *pJPol)

{
  FactoredDecPOMDPDiscreteInterface *pFVar1;
  size_t sVar2;
  undefined8 uVar3;
  int iVar4;
  
  sVar2 = (pJPol->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
          _m_depth;
  pFVar1 = this->_m_fDecPOMDP;
  uVar3 = (**(code **)(*(long *)((long)&pFVar1->field_0x0 + *(long *)(*(long *)pFVar1 + -0xf8)) +
                      0x188))((long)&pFVar1->field_0x0 + *(long *)(*(long *)pFVar1 + -0xf8));
  (*fsaoh->_vptr_FactoredStateAOHDistribution[7])(fsaoh,uVar3);
  (*fsaoh->_vptr_FactoredStateAOHDistribution[8])(fsaoh);
  for (iVar4 = (int)sVar2; iVar4 != 0; iVar4 = iVar4 + -1) {
    (*fsaoh->_vptr_FactoredStateAOHDistribution[6])(fsaoh,pJPol);
  }
  return;
}

Assistant:

void PlanningUnitFactoredDecPOMDPDiscrete::
ComputeFSAOHDist(
        FactoredStateAOHDistribution* fsaoh, 
        const PartialJointPolicyDiscretePure& pJPol) const
{
    Index depth = pJPol.GetDepth();
    //cout << "computing factored FSAOHDist for policy of depth"<< depth<<endl;
    fsaoh->InitializeFromISD( GetFDPOMDPD()->GetFactoredISD() );
    fsaoh->SanityCheck();
    Index lastStage;
    if(depth > 0)
        //depth 1 specifies action for t=0 -> compute FSAOH for t=1
        lastStage = depth; 
    else
        return;

    //cerr<<"starting updates from t=0 to t<"<<lastStage<<endl;
    for(Index t=0 ; t < lastStage; t++)
        fsaoh->Update(pJPol);
}